

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void Curl_attach_connnection(Curl_easy *data,connectdata *conn)

{
  data->conn = conn;
  Curl_llist_insert_next(&conn->easyq,(conn->easyq).tail,data,&data->conn_queue);
  return;
}

Assistant:

void Curl_attach_connnection(struct Curl_easy *data,
                             struct connectdata *conn)
{
  DEBUGASSERT(!data->conn);
  DEBUGASSERT(conn);
  data->conn = conn;
  Curl_llist_insert_next(&conn->easyq, conn->easyq.tail, data,
                         &data->conn_queue);
}